

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O3

uint32_t longest_match_avx2(deflate_state *s,Pos cur_match)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  Pos *pPVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [32];
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uchar *puVar15;
  uint uVar16;
  ulong uVar17;
  uint local_60;
  ulong local_48;
  
  uVar1 = s->strstart;
  uVar17 = (ulong)uVar1;
  uVar2 = s->w_mask;
  puVar3 = s->window;
  uVar14 = 2;
  if (s->prev_length != 0) {
    uVar14 = s->prev_length;
  }
  uVar16 = 0xffffffff;
  if (3 < uVar14) {
    uVar16 = (uint)(uVar14 < 8) << 2 | 0xfffffff9;
  }
  uVar9 = *(ulong *)(puVar3 + (uVar16 + uVar14) + uVar17);
  local_60 = (uint)(uVar9 >> 0x10) & 0xffff;
  local_48 = uVar9 >> 0x20;
  puVar15 = puVar3 + (uVar16 + uVar14);
  uVar16 = s->max_chain_length >> 2;
  if (uVar14 < s->good_match) {
    uVar16 = s->max_chain_length;
  }
  uVar8 = s->w_size - 0x106;
  uVar10 = (short)uVar1 - (short)uVar8;
  if (uVar1 < uVar8) {
    uVar10 = 0;
  }
  pPVar4 = s->prev;
  lVar5 = *(long *)(puVar3 + uVar17);
  do {
    if (uVar1 <= cur_match) {
      return uVar14;
    }
    if (uVar14 < 4) {
      while ((uVar11 = (ulong)cur_match, *(short *)(puVar15 + uVar11) != (short)uVar9 ||
             (*(short *)(puVar3 + uVar11) != (short)lVar5))) {
        if (uVar16 == 1) {
          return uVar14;
        }
        cur_match = pPVar4[cur_match & uVar2];
        uVar16 = uVar16 - 1;
        if (cur_match <= uVar10) {
          return uVar14;
        }
      }
    }
    else if (uVar14 < 8) {
      while ((uVar11 = (ulong)cur_match,
             *(uint *)(puVar15 + uVar11) != (local_60 << 0x10 | (uint)(uVar9 & 0xffff)) ||
             (*(int *)(puVar3 + uVar11) != (int)lVar5))) {
        if (uVar16 == 1) {
          return uVar14;
        }
        cur_match = pPVar4[cur_match & uVar2];
        uVar16 = uVar16 - 1;
        if (cur_match <= uVar10) {
          return uVar14;
        }
      }
    }
    else {
      while ((uVar11 = (ulong)cur_match,
             *(ulong *)(puVar15 + uVar11) !=
             (local_48 << 0x20 | uVar9 & 0xffff | (ulong)(local_60 << 0x10)) ||
             (*(long *)(puVar3 + uVar11) != lVar5))) {
        if (uVar16 == 1) {
          return uVar14;
        }
        cur_match = pPVar4[cur_match & uVar2];
        uVar16 = uVar16 - 1;
        if (cur_match <= uVar10) {
          return uVar14;
        }
      }
    }
    lVar13 = 0;
    do {
      auVar7 = vpcmpeqb_avx2(*(undefined1 (*) [32])(puVar3 + lVar13 + uVar17 + 2),
                             *(undefined1 (*) [32])(puVar3 + lVar13 + uVar11 + 2));
      uVar8 = (uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3
              | (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6
              | (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9
              | (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar7 >> 0x7f,0) << 0xf |
              (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar7 >> 0xbf,0) << 0x17
              | (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18 |
              (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f
      ;
      uVar12 = (uint)lVar13;
      if (uVar8 != 0xffffffff) {
        uVar8 = ~uVar8;
        iVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        uVar12 = uVar12 + iVar6;
        goto LAB_00103918;
      }
      auVar7 = vpcmpeqb_avx2(*(undefined1 (*) [32])(puVar3 + lVar13 + uVar17 + 0x22),
                             *(undefined1 (*) [32])(puVar3 + lVar13 + uVar11 + 0x22));
      uVar8 = (uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3
              | (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6
              | (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9
              | (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar7 >> 0x7f,0) << 0xf |
              (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar7 >> 0xbf,0) << 0x17
              | (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18 |
              (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f
      ;
      if (uVar8 != 0xffffffff) {
        uVar8 = ~uVar8;
        iVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        uVar12 = uVar12 + iVar6 + 0x20;
        goto LAB_00103918;
      }
      lVar13 = lVar13 + 0x40;
    } while (uVar12 < 0xc0);
    uVar12 = 0x100;
LAB_00103918:
    uVar8 = uVar12 + 2;
    if (uVar14 < uVar8) {
      s->match_start = (uint)uVar11;
      if (s->lookahead < uVar8) {
        return s->lookahead;
      }
      if ((uint)s->nice_match <= uVar8) {
        return uVar8;
      }
      uVar14 = -(uint)(uVar12 < 6) | 0xfffffffb;
      if (uVar12 < 2) {
        uVar14 = 1;
      }
      uVar9 = *(ulong *)(puVar3 + (uVar14 + uVar12) + uVar17);
      local_60 = (uint)(uVar9 >> 0x10) & 0xffff;
      local_48 = uVar9 >> 0x20;
      puVar15 = puVar3 + (uVar14 + uVar12);
      uVar14 = uVar8;
    }
    else if (s->level < 5) {
      return uVar14;
    }
    uVar16 = uVar16 - 1;
    if (uVar16 == 0) {
      return uVar14;
    }
    cur_match = pPVar4[(uint)uVar11 & uVar2];
    if (cur_match <= uVar10) {
      return uVar14;
    }
  } while( true );
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}